

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-seri.c
# Opt level: O2

void * rb_read(read_block *rb,int sz)

{
  int iVar1;
  
  if (rb->len < sz) {
    return (void *)0x0;
  }
  iVar1 = rb->ptr;
  rb->ptr = sz + iVar1;
  rb->len = rb->len - sz;
  return rb->buffer + iVar1;
}

Assistant:

static void *
rb_read(struct read_block *rb, int sz) {
	if (rb->len < sz) {
		return NULL;
	}

	int ptr = rb->ptr;
	rb->ptr += sz;
	rb->len -= sz;
	return rb->buffer + ptr;
}